

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.cpp
# Opt level: O0

void DebugDer(ostream *outFile,uchar *pIn,size_t cbIn,unsigned_long level)

{
  uchar *puVar1;
  bool bVar2;
  exception *peVar3;
  ostream *poVar4;
  void *pvVar5;
  BasicDerType local_88;
  int local_78;
  char local_71;
  int local_70;
  char local_69;
  int local_68;
  char local_61;
  size_t local_60;
  size_t cbType;
  uchar *pType;
  DerTypeContainer type;
  size_t offset;
  size_t cbRead;
  size_t size;
  unsigned_long level_local;
  size_t cbIn_local;
  uchar *pIn_local;
  ostream *outFile_local;
  
  size = level;
  level_local = cbIn;
  cbIn_local = (size_t)pIn;
  pIn_local = (uchar *)outFile;
  if (cbIn < 2) {
    peVar3 = (exception *)__cxa_allocate_exception(8);
    std::exception::exception(peVar3);
    __cxa_throw(peVar3,&std::exception::typeinfo,std::exception::~exception);
  }
  cbRead = 0;
  offset = 0;
  type._class = Universal;
  type.constructed = false;
  type._9_3_ = 0;
  while( true ) {
    if (level_local <= (ulong)type._4_8_) {
      return;
    }
    DerTypeContainer::DerTypeContainer
              ((DerTypeContainer *)((long)&pType + 4),*(uchar *)(cbIn_local + type._4_8_));
    cbType = cbIn_local + type._4_8_;
    local_60 = level_local - type._4_8_;
    type._4_8_ = type._4_8_ + 1;
    bVar2 = DecodeSize((uchar *)(cbIn_local + type._4_8_),level_local - type._4_8_,&cbRead,&offset);
    puVar1 = pIn_local;
    if (!bVar2) break;
    type._4_8_ = offset + type._4_8_;
    local_61 = (char)std::setfill<char>(' ');
    poVar4 = std::operator<<(puVar1,local_61);
    local_68 = (int)std::setw((int)size + 1);
    poVar4 = std::operator<<(poVar4,(_Setw)local_68);
    std::operator<<(poVar4,"  ");
    if (((undefined1)type.type & Boolean) == EOC) {
      poVar4 = operator<<((ostream *)pIn_local,(DerTypeContainer *)((long)&pType + 4));
      poVar4 = std::operator<<(poVar4," 0x");
      local_71 = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,local_71);
      local_78 = (int)std::setw(2);
      poVar4 = std::operator<<(poVar4,(_Setw)local_78);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar5,cbRead);
      poVar4 = std::operator<<(poVar4," ");
      BasicDerType::BasicDerType(&local_88,(uchar *)cbType,local_60);
      poVar4 = operator<<(poVar4,&local_88);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = operator<<((ostream *)pIn_local,(DerTypeContainer *)((long)&pType + 4));
      poVar4 = std::operator<<(poVar4," 0x");
      local_69 = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,local_69);
      local_70 = (int)std::setw(2);
      poVar4 = std::operator<<(poVar4,(_Setw)local_70);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
      pvVar5 = (void *)std::ostream::operator<<(pvVar5,cbRead);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      DebugDer((ostream *)pIn_local,(uchar *)(cbIn_local + type._4_8_),cbRead,size + 1);
    }
    type._4_8_ = cbRead + type._4_8_;
  }
  peVar3 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(peVar3);
  __cxa_throw(peVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void DebugDer(std::ostream& outFile, const unsigned char * pIn, size_t cbIn, unsigned long level)
{
	if (cbIn < 2)
		throw std::exception(); // Corrupt input

	size_t size = 0;
	size_t cbRead = 0;
	size_t offset = 0;

	while (offset < cbIn)
	{
		DerTypeContainer type(*(pIn + offset));
		const unsigned char* pType = pIn + offset;
		size_t cbType = cbIn - offset;

		offset += 1;
		if (!DecodeSize(pIn + offset, cbIn - offset, size, cbRead))
			throw std::exception(); // Corrupt input

		offset += cbRead;

        outFile << std::setfill(' ') << std::setw(level + 1) << "  ";

		if (type.constructed)
		{
			// It is a set, or sequence, possibly app-specific
			// Print just the type, and the size, then recurse
            outFile << type << " 0x" << std::setfill('0') << std::setw(2) << std::hex << size << std::endl;
			DebugDer(outFile, pIn + offset, size, level + 1);
		}
		else
		{
			// It is a primitive type
            outFile << type << " 0x" << std::setfill('0') << std::setw(2) << std::hex << size << " " << BasicDerType(pType, cbType) << std::endl;
		}

		// And increment to the next item
		offset += static_cast<size_t>(size);

	}

}